

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Value __thiscall wabt::interp::Instance::ResolveInitExpr(Instance *this,Store *store,InitExpr init)

{
  pointer pRVar1;
  undefined8 unaff_RBX;
  ulong uVar2;
  ulong uVar3;
  Value VVar4;
  RefPtr<wabt::interp::Global> local_38;
  
  uVar2 = 0;
  uVar3 = 0;
  switch(init.kind) {
  case None:
    abort();
  case I32:
  case F32:
    uVar2 = (ulong)init.field_1.i32_;
    uVar3 = 0;
    break;
  case I64:
    uVar2 = (ulong)init.field_1.i32_;
    uVar3 = (ulong)(uint)init.field_1.i64_._4_4_;
    break;
  case F64:
    uVar2 = init.field_1._0_8_;
    uVar3 = uVar2 >> 0x20;
    break;
  case V128:
    uVar2 = (ulong)init.field_1.i32_;
    unaff_RBX = init.field_1._8_8_;
    uVar3 = (ulong)(uint)init.field_1.i64_._4_4_;
    break;
  case GlobalGet:
    RefPtr<wabt::interp::Global>::RefPtr
              (&local_38,store,
               (Ref)(this->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[init.field_1.i32_].index);
    uVar2 = ((local_38.obj_)->value_).i64_;
    unaff_RBX = *(undefined8 *)((long)&(local_38.obj_)->value_ + 8);
    FreeList<wabt::interp::Ref>::Delete(&(local_38.store_)->roots_,local_38.root_index_);
    uVar3 = uVar2 >> 0x20;
    break;
  case RefNull:
    break;
  case RefFunc:
    pRVar1 = (this->funcs_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)(uint)pRVar1[init.field_1.i32_].index;
    uVar3 = (ulong)*(uint *)((long)&pRVar1[init.field_1.i32_].index + 4);
    break;
  default:
    uVar2 = 0;
  }
  VVar4._0_8_ = uVar2 & 0xffffffff | uVar3 << 0x20;
  VVar4._8_8_ = unaff_RBX;
  return VVar4;
}

Assistant:

Value Instance::ResolveInitExpr(Store& store, InitExpr init) {
  Value result;
  switch (init.kind) {
    case InitExprKind::I32:      result.Set(init.i32_); break;
    case InitExprKind::I64:      result.Set(init.i64_); break;
    case InitExprKind::F32:      result.Set(init.f32_); break;
    case InitExprKind::F64:      result.Set(init.f64_); break;
    case InitExprKind::V128:     result.Set(init.v128_); break;
    case InitExprKind::GlobalGet: {
      Global::Ptr global{store, globals_[init.index_]};
      result = global->Get();
      break;
    }
    case InitExprKind::RefFunc: {
      result.Set(funcs_[init.index_]);
      break;
    }
    case InitExprKind::RefNull:
      result.Set(Ref::Null);
      break;

    case InitExprKind::None:
      WABT_UNREACHABLE;
  }
  return result;
}